

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O3

void Hop_ObjPrintVerbose(Hop_Obj_t *pObj,int fHaig)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopUtil.c"
                  ,0x1ca,"void Hop_ObjPrintVerbose(Hop_Obj_t *, int)");
  }
  printf("Node %p : ",pObj);
  uVar1 = *(uint *)&pObj->field_0x20 & 7;
  if (uVar1 == 2) {
    pcVar2 = "PI";
  }
  else {
    if (uVar1 != 1) {
      pcVar3 = "\'";
      pcVar2 = "\'";
      if (((ulong)pObj->pFanin0 & 1) == 0) {
        pcVar2 = " ";
      }
      if (((ulong)pObj->pFanin1 & 1) == 0) {
        pcVar3 = " ";
      }
      printf("AND( %p%s, %p%s )",(ulong)pObj->pFanin0 & 0xfffffffffffffffe,pcVar2,
             (ulong)pObj->pFanin1 & 0xfffffffffffffffe,pcVar3);
      goto LAB_007b6fee;
    }
    pcVar2 = "constant 1";
  }
  printf(pcVar2);
LAB_007b6fee:
  printf(" (refs = %3d)",(ulong)(*(uint *)&pObj->field_0x20 >> 6));
  return;
}

Assistant:

void Hop_ObjPrintVerbose( Hop_Obj_t * pObj, int fHaig )
{
    assert( !Hop_IsComplement(pObj) );
    printf( "Node %p : ", pObj );
    if ( Hop_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( Hop_ObjIsPi(pObj) )
        printf( "PI" );
    else
        printf( "AND( %p%s, %p%s )", 
            Hop_ObjFanin0(pObj), (Hop_ObjFaninC0(pObj)? "\'" : " "), 
            Hop_ObjFanin1(pObj), (Hop_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", Hop_ObjRefs(pObj) );
}